

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ech_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  int iVar2;
  uchar *data;
  size_t len;
  undefined1 local_60 [8];
  CBB ech_body;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  ech_body.u._28_4_ = type;
  if (type == ssl_client_hello_inner) {
    iVar2 = CBB_add_u16(out,0xfe0d);
    if (((iVar2 != 0) && (iVar2 = CBB_add_u16(out,1), iVar2 != 0)) &&
       (iVar2 = CBB_add_u8(out,'\x01'), iVar2 != 0)) {
      return true;
    }
    hs_local._7_1_ = false;
  }
  else {
    bVar1 = Array<unsigned_char>::empty(&hs->ech_client_outer);
    if (bVar1) {
      hs_local._7_1_ = true;
    }
    else {
      iVar2 = CBB_add_u16(out,0xfe0d);
      if (((iVar2 != 0) && (iVar2 = CBB_add_u16_length_prefixed(out,(CBB *)local_60), iVar2 != 0))
         && (iVar2 = CBB_add_u8((CBB *)local_60,'\0'), iVar2 != 0)) {
        data = Array<unsigned_char>::data(&hs->ech_client_outer);
        len = Array<unsigned_char>::size(&hs->ech_client_outer);
        iVar2 = CBB_add_bytes((CBB *)local_60,data,len);
        if ((iVar2 != 0) && (iVar2 = CBB_flush(out), iVar2 != 0)) {
          return true;
        }
      }
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ech_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                    CBB *out_compressible,
                                    ssl_client_hello_type_t type) {
  if (type == ssl_client_hello_inner) {
    if (!CBB_add_u16(out, TLSEXT_TYPE_encrypted_client_hello) ||
        !CBB_add_u16(out, /* length */ 1) ||
        !CBB_add_u8(out, ECH_CLIENT_INNER)) {
      return false;
    }
    return true;
  }

  if (hs->ech_client_outer.empty()) {
    return true;
  }

  CBB ech_body;
  if (!CBB_add_u16(out, TLSEXT_TYPE_encrypted_client_hello) ||
      !CBB_add_u16_length_prefixed(out, &ech_body) ||
      !CBB_add_u8(&ech_body, ECH_CLIENT_OUTER) ||
      !CBB_add_bytes(&ech_body, hs->ech_client_outer.data(),
                     hs->ech_client_outer.size()) ||
      !CBB_flush(out)) {
    return false;
  }
  return true;
}